

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult __thiscall
testing::internal::FloatingPointLE<double>
          (internal *this,char *expr1,char *expr2,double val1,double val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  long in_FS_OFFSET;
  AssertionResult AVar3;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  stringstream val2_ss;
  stringstream val1_ss;
  AssertionResult local_3a0;
  FloatingPointUnion local_390;
  FloatingPointUnion local_388;
  char *local_380;
  char *local_378;
  string local_370;
  string local_350;
  stringstream local_330 [16];
  long local_320;
  undefined8 auStack_318 [46];
  stringstream local_1a8 [16];
  long local_198;
  undefined8 auStack_190 [46];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_380 = expr2;
  local_378 = expr1;
  if (val2 <= val1) {
    local_390.value_ = val2;
    local_388.value_ = val1;
    bVar1 = FloatingPoint<double>::AlmostEquals
                      ((FloatingPoint<double> *)&local_388,(FloatingPoint<double> *)&local_390);
    expr2 = (char *)extraout_RDX;
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      *(undefined8 *)((long)auStack_190 + *(long *)(local_198 + -0x18)) = 0x11;
      std::ostream::_M_insert<double>(val1);
      std::__cxx11::stringstream::stringstream(local_330);
      *(undefined8 *)((long)auStack_318 + *(long *)(local_320 + -0x18)) = 0x11;
      std::ostream::_M_insert<double>(val2);
      local_3a0.success_ = false;
      local_3a0.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_3a0,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_378);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") <= (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_380);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x16a691);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x16a014);
      StringStreamToString(&local_350,(stringstream *)local_1a8);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_350);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
      StringStreamToString(&local_370,(stringstream *)local_330);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_370);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_350);
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&local_3a0.message_);
      std::__cxx11::stringstream::~stringstream(local_330);
      std::__cxx11::stringstream::~stringstream(local_1a8);
      expr2 = (char *)extraout_RDX_00;
      goto LAB_0015af70;
    }
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_0015af70:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    AVar3.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2
    ;
    AVar3._0_8_ = this;
    return AVar3;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}